

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::UniformValue::UniformValue
          (UniformValue *this,UniformType *_type,UniformValueGenerator *generator)

{
  bool bVar1;
  GLenum GVar2;
  GLint GVar3;
  pair<int,_int> pVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  GLfloat GVar8;
  float local_f4;
  float local_ec;
  ulong local_70;
  size_t elem_4;
  size_t elem_3;
  size_t elem_2;
  size_t elem_1;
  size_t elem;
  int iStack_40;
  int iStack_38;
  int sizeColumn;
  int sizeRow;
  UniformValueGenerator *generator_local;
  UniformType *_type_local;
  UniformValue *this_local;
  
  std::vector<float,_std::allocator<float>_>::vector(&this->fValues);
  std::vector<int,_std::allocator<int>_>::vector(&this->iValues);
  std::vector<int,_std::allocator<int>_>::vector(&this->uValues);
  UniformType::UniformType(&this->type,_type);
  pVar4 = UniformType::getSize(&this->type);
  iStack_38 = pVar4.first;
  pVar4 = UniformType::getSize(&this->type);
  iStack_40 = pVar4.second;
  bVar1 = UniformType::isStruct(&this->type);
  if (!bVar1) {
    GVar2 = UniformType::getBaseType(&this->type);
    if (GVar2 == 0x1404) {
      if (iStack_40 != 1) {
        __assert_fail("sizeColumn == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                      ,0x263,
                      "glcts::(anonymous namespace)::UniformValue::UniformValue(const UniformType &, UniformValueGenerator &)"
                     );
      }
      std::vector<int,_std::allocator<int>_>::resize
                (&this->iValues,(long)(iStack_38 * (this->type).arraySize));
      for (elem_1 = 0; sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->iValues),
          elem_1 < sVar5; elem_1 = elem_1 + 1) {
        GVar3 = UniformValueGenerator::genI(generator);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->iValues,elem_1);
        *pvVar6 = GVar3;
      }
    }
    else {
      GVar2 = UniformType::getBaseType(&this->type);
      if (GVar2 == 0x1405) {
        if (iStack_40 != 1) {
          __assert_fail("sizeColumn == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                        ,0x26c,
                        "glcts::(anonymous namespace)::UniformValue::UniformValue(const UniformType &, UniformValueGenerator &)"
                       );
        }
        std::vector<int,_std::allocator<int>_>::resize
                  (&this->uValues,(long)(iStack_38 * (this->type).arraySize));
        for (elem_2 = 0; sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->uValues),
            elem_2 < sVar5; elem_2 = elem_2 + 1) {
          GVar3 = UniformValueGenerator::genI(generator);
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->uValues,elem_2);
          *pvVar6 = GVar3;
        }
      }
      else {
        GVar2 = UniformType::getBaseType(&this->type);
        if (GVar2 == 0x1406) {
          std::vector<float,_std::allocator<float>_>::resize
                    (&this->fValues,(long)(iStack_40 * iStack_38 * (this->type).arraySize));
          for (elem_3 = 0; sVar5 = std::vector<float,_std::allocator<float>_>::size(&this->fValues),
              elem_3 < sVar5; elem_3 = elem_3 + 1) {
            GVar8 = UniformValueGenerator::genF(generator);
            pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](&this->fValues,elem_3);
            *pvVar7 = GVar8;
          }
        }
        else {
          GVar2 = UniformType::getBaseType(&this->type);
          if (GVar2 != 0x82e6) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                          ,0x28c,
                          "glcts::(anonymous namespace)::UniformValue::UniformValue(const UniformType &, UniformValueGenerator &)"
                         );
          }
          std::vector<float,_std::allocator<float>_>::resize
                    (&this->fValues,(long)((this->type).arraySize << 2));
          for (elem_4 = 0; sVar5 = std::vector<float,_std::allocator<float>_>::size(&this->fValues),
              elem_4 < sVar5; elem_4 = elem_4 + 1) {
            local_ec = (float)elem_4;
            sVar5 = std::vector<float,_std::allocator<float>_>::size(&this->fValues);
            local_f4 = (float)sVar5;
            pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](&this->fValues,elem_4);
            *pvVar7 = local_ec / local_f4;
          }
          std::vector<int,_std::allocator<int>_>::resize
                    (&this->iValues,(long)(this->type).arraySize);
          for (local_70 = 0; sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->iValues),
              local_70 < sVar5; local_70 = local_70 + 1) {
            GVar3 = UniformValueGenerator::genI(generator);
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->iValues,local_70);
            *pvVar6 = GVar3 % 0x10;
          }
        }
      }
    }
  }
  return;
}

Assistant:

UniformValue(const UniformType& _type, UniformValueGenerator& generator) : type(_type)
	{
		const int sizeRow	= type.getSize().first;
		const int sizeColumn = type.getSize().second;

		if (type.isStruct())
		{
			return;
		}

		if (type.getBaseType() == GL_INT)
		{
			assert(sizeColumn == 1);
			iValues.resize(sizeRow * type.arraySize);
			for (size_t elem = 0; elem < iValues.size(); elem++)
			{
				iValues[elem] = generator.genI();
			}
		}
		else if (type.getBaseType() == GL_UNSIGNED_INT)
		{
			assert(sizeColumn == 1);
			uValues.resize(sizeRow * type.arraySize);
			for (size_t elem = 0; elem < uValues.size(); elem++)
			{
				uValues[elem] = static_cast<GLuint>(generator.genI());
			}
		}
		else if (type.getBaseType() == GL_FLOAT)
		{
			fValues.resize(sizeColumn * sizeRow * type.arraySize);
			for (size_t elem = 0; elem < fValues.size(); elem++)
			{
				fValues[elem] = generator.genF();
			}
		}
		else if (type.getBaseType() == GL_SAMPLER)
		{
			//color ref value
			fValues.resize(4 * type.arraySize);
			for (size_t elem = 0; elem < fValues.size(); elem++)
			{
				fValues[elem] = float(elem) / float(fValues.size());
			}
			//uniform value
			iValues.resize(type.arraySize);
			for (size_t elem = 0; elem < iValues.size(); elem++)
			{
				iValues[elem] = generator.genI() % 16;
			}
		}
		else
		{
			assert(0);
		}
	}